

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2010.hpp
# Opt level: O1

void bcl::st2010::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  double *pdVar5;
  pointer pvVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<double,_std::allocator<double>_> accum;
  allocator_type local_49;
  value_type local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)pdVar3 - (long)pdVar2 >> 3;
  local_48 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,lVar13 + 1,&local_48,&local_49);
  pdVar5 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar14 = 0.0;
  pdVar4 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar8 = pdVar4; pdVar8 != pdVar5; pdVar8 = pdVar8 + 1) {
    dVar14 = dVar14 + *pdVar8;
  }
  pdVar8 = pdVar4 + 1;
  pdVar10 = pdVar4;
  pdVar11 = pdVar4;
  if (pdVar8 != pdVar5 && pdVar4 != pdVar5) {
    do {
      pdVar10 = pdVar8;
      if (*pdVar8 < *pdVar11 || *pdVar8 == *pdVar11) {
        pdVar10 = pdVar11;
      }
      pdVar8 = pdVar8 + 1;
      pdVar11 = pdVar10;
    } while (pdVar8 != pdVar5);
  }
  dVar1 = *pdVar10;
  *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  if (pdVar3 != pdVar2) {
    dVar15 = *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      dVar15 = dVar15 + pdVar4[lVar9] / dVar14;
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9 + 1] = dVar15;
      lVar9 = lVar9 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar9);
  }
  if (pdVar3 != pdVar2) {
    pvVar6 = (tm->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = lVar13 + (ulong)(lVar13 == 0);
    lVar9 = 0;
    do {
      lVar7 = *(long *)&pvVar6[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar12 = 0;
      do {
        auVar19._0_8_ =
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9 + 1] + dVar1 / dVar14;
        dVar15 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9] + dVar1 / dVar14;
        auVar18._8_8_ =
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12 + 1] + 1.0;
        auVar18._0_8_ =
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12 + 1];
        auVar19._8_8_ = auVar19._0_8_;
        auVar19 = minpd(auVar18,auVar19);
        auVar16._8_8_ =
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12] + 1.0;
        auVar16._0_8_ =
             local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12];
        auVar17._8_8_ = dVar15;
        auVar17._0_8_ = dVar15;
        auVar17 = maxpd(auVar16,auVar17);
        auVar20._0_8_ = auVar19._0_8_ - auVar17._0_8_;
        auVar20._8_8_ = auVar19._8_8_ - auVar17._8_8_;
        auVar17 = maxpd(ZEXT816(0),auVar20);
        *(double *)(lVar7 + lVar12 * 8) = (auVar17._8_8_ + auVar17._0_8_) / (pdVar4[lVar9] / dVar14)
        ;
        lVar12 = lVar12 + 1;
      } while (lVar13 != lVar12);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar13);
  }
  operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0)) / (weights[i] / sum);
      }
    }
  }